

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O1

void __thiscall StringBuffer::appendChar(StringBuffer *this,char c)

{
  ulong uVar1;
  unsigned_long uVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar1 = this->saLength;
  if (uVar1 == this->sLength) {
    uVar4 = uVar1 >> 3;
    if ((long)(uVar1 >> 3) < sbDefaultBoost) {
      uVar4 = sbDefaultBoost;
    }
    this->saLength = uVar4 + uVar1;
    pcVar3 = (char *)realloc(this->sData,uVar4 + uVar1 + 1);
    this->sData = pcVar3;
  }
  this->sData[this->sLength] = c;
  uVar2 = this->sLength;
  this->sLength = uVar2 + 1;
  this->sData[uVar2 + 1] = '\0';
  return;
}

Assistant:

void StringBuffer::appendChar(const char c) {
  long addThis;
  if (saLength == sLength) {
    addThis = saLength / 8;
    if (StringBuffer::sbDefaultBoost > addThis)
      addThis = StringBuffer::sbDefaultBoost;
    saLength += addThis;
    sData = (char *)realloc(sData, sizeof(char) * (saLength + 1));
  }
  sData[sLength] = c;
  sData[++sLength] = 0;
}